

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O0

void __thiscall Assimp::STEP::DB::InternInsert(DB *this,LazyObject *lz)

{
  char *__s;
  bool bVar1;
  mapped_type *ppLVar2;
  reference ppVar3;
  _Self local_68 [3];
  allocator<char> local_49;
  key_type local_48;
  _Self local_28;
  iterator it;
  LazyObject *local_18;
  LazyObject *lz_local;
  DB *this_local;
  
  local_18 = lz;
  lz_local = (LazyObject *)this;
  it._M_node = (_Base_ptr)LazyObject::GetID(lz);
  ppLVar2 = std::
            map<unsigned_long,_const_Assimp::STEP::LazyObject_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_Assimp::STEP::LazyObject_*>_>_>
            ::operator[](&this->objects,(key_type_conflict *)&it);
  *ppLVar2 = lz;
  __s = local_18->type;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,__s,&local_49);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>_>
       ::find(&this->objects_bytype,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  local_68[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>_>
       ::end(&this->objects_bytype);
  bVar1 = std::operator!=(&local_28,local_68);
  if (bVar1) {
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>_>_>
             ::operator*(&local_28);
    std::
    set<const_Assimp::STEP::LazyObject_*,_std::less<const_Assimp::STEP::LazyObject_*>,_std::allocator<const_Assimp::STEP::LazyObject_*>_>
    ::insert(&ppVar3->second,&local_18);
  }
  return;
}

Assistant:

void InternInsert(const LazyObject* lz) {
            objects[lz->GetID()] = lz;

            const ObjectMapByType::iterator it = objects_bytype.find( lz->type );
            if (it != objects_bytype.end()) {
                (*it).second.insert(lz);
            }
        }